

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O1

void __thiscall duckdb::ExpressionBinder::~ExpressionBinder(ExpressionBinder *this)

{
  Binder *this_00;
  bool bVar1;
  
  this->_vptr_ExpressionBinder = (_func_int **)&PTR__ExpressionBinder_019af3b0;
  bVar1 = Binder::HasActiveBinder(this->binder);
  if (bVar1) {
    this_00 = this->binder;
    if ((this->stored_binder).ptr == (ExpressionBinder *)0x0) {
      Binder::PopExpressionBinder(this_00);
    }
    else {
      optional_ptr<duckdb::ExpressionBinder,_true>::CheckValid(&this->stored_binder);
      Binder::SetActiveBinder(this_00,(this->stored_binder).ptr);
    }
  }
  ::std::vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
  ::~vector(&(this->bound_columns).
             super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           );
  LogicalType::~LogicalType(&this->target_type);
  return;
}

Assistant:

ExpressionBinder::~ExpressionBinder() {
	if (binder.HasActiveBinder()) {
		if (stored_binder) {
			binder.SetActiveBinder(*stored_binder);
		} else {
			binder.PopExpressionBinder();
		}
	}
}